

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>::operator-=
          (uintwide_t<512U,_unsigned_int,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  long lVar1;
  
  if (this == (uintwide_t<512U,_unsigned_int,_void,_false> *)other) {
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 4) {
      *(undefined4 *)((long)(this->values).super_array<unsigned_int,_16UL>.elems + lVar1) = 0;
    }
  }
  else {
    uintwide_t<512u,unsigned_int,void,false>::
    eval_subtract_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>
              ((uint *)this,(uint *)this,(uint *)other,0x10,false);
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator-=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary subtraction function.
        const auto has_borrow = eval_subtract_n(values.begin(),
                                                values.cbegin(),
                                                other.values.cbegin(),
                                                number_of_limbs,
                                                false);

        static_cast<void>(has_borrow);
      }

      return *this;
    }